

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O0

bool __thiscall EOPlus::Lexer::GetChar(Lexer *this,char *c)

{
  long *plVar1;
  ulong uVar2;
  variant local_b0;
  Token local_70;
  char *local_20;
  char *c_local;
  Lexer *this_local;
  
  local_20 = c;
  c_local = (char *)this;
  plVar1 = (long *)std::istream::get((char *)this->is);
  uVar2 = std::ios::operator!((ios *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
  if ((uVar2 & 1) == 0) {
    this->col = this->col + 1;
    if (*local_20 == '\n') {
      util::variant::variant(&local_b0);
      Token::Token(&local_70,NewLine,&local_b0);
      std::queue<EOPlus::Token,_std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>_>::push
                (&this->token_buffer,&local_70);
      Token::~Token(&local_70);
      util::variant::~variant(&local_b0);
      this->row = this->row + 1;
      this->col = 0;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Lexer::GetChar(char& c)
	{
		if (!is.get(c))
			return false;

		++this->col;

		if (c == '\n')
		{
			this->token_buffer.push(Token(Token::NewLine));
			++this->row;
			this->col = 0;
		}

		return true;
	}